

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int FindLatestHokuyoMessage(char *buf,int buflen,char **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  int len;
  char *ptr;
  
  ptr = (char *)0x0;
  len = 0;
  iVar1 = FindHokuyoMessage(buf,buflen,&ptr,&len);
  if (iVar1 == 0) {
    do {
      *pFoundMsg = ptr;
      *pFoundMsgTmpLen = len;
      iVar1 = FindHokuyoMessage(ptr + 0x1d,len + -0x1d,&ptr,&len);
    } while (iVar1 == 0);
    iVar1 = 0;
  }
  else {
    *pFoundMsg = (char *)0x0;
    *pFoundMsgTmpLen = 0;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int FindLatestHokuyoMessage(char* buf, int buflen, char** pFoundMsg, int* pFoundMsgTmpLen)
{
	char* ptr = NULL;
	int len = 0;
	int msglen = 0;

	if (FindHokuyoMessage(buf, buflen, &ptr, &len) != EXIT_SUCCESS)
	{
		*pFoundMsg = NULL;
		*pFoundMsgTmpLen = 0;
		return EXIT_FAILURE;
	}
	for (;;) 
	{
		// Save the position of the beginning of the message.
		*pFoundMsg = ptr;
		*pFoundMsgTmpLen = len;

		// Expected min message length.
		msglen = MIN_STANDARD_BUF_LEN_HOKUYO;

		// Search just after the message.
		if (FindHokuyoMessage(*pFoundMsg+msglen, *pFoundMsgTmpLen-msglen, &ptr, &len) != EXIT_SUCCESS)
		{
			break;
		}
	}

	return EXIT_SUCCESS;
}